

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

void writeOutput(FILE *outf,char *groupname,dotNode *(*results) [7],int spike,int method,
                char *extrastr,float probeRad)

{
  long lVar1;
  long *plVar2;
  double dVar3;
  atom *paVar4;
  residue_t *prVar5;
  atom *paVar6;
  residue_t *prVar7;
  long lVar8;
  FILE *pFVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  int iVar19;
  char *pcVar20;
  char *pcVar21;
  dotNode *pdVar22;
  dotNode_t *pdVar23;
  FILE *__stream;
  uint uVar24;
  long lVar25;
  bool bVar26;
  double dVar27;
  undefined4 uVar28;
  char ptm [2];
  char *local_1e0;
  undefined1 local_1d0;
  undefined1 uStack_1cf;
  char local_1ce;
  undefined1 local_1cd;
  undefined1 uStack_1cc;
  undefined1 uStack_1cb;
  undefined1 uStack_1ca;
  void *local_1c8;
  uint local_1c0;
  int local_1bc;
  FILE *local_1b8;
  dotNode *(*local_1b0) [7];
  char extraMstr [32];
  long local_180;
  char strcName [6];
  char *mast [7];
  char lastpointid [100];
  char pointid [100];
  
  ptm[0] = ' ';
  ptm[1] = '\0';
  mast[6] = "H-bonds";
  mast[4] = "bad overlap";
  mast[5] = "worse overlap";
  uStack_1cc = 0;
  uStack_1cb = 0;
  uStack_1ca = 0;
  local_1d0 = 0;
  uStack_1cf = 0;
  local_1ce = '\0';
  local_1cd = 0;
  mast[2] = "weak H-bonds";
  mast[3] = "small overlap";
  if (probeRad <= 0.25) {
    probeRad = 0.25;
  }
  mast[0] = "wide contact";
  mast[1] = "close contact";
  local_1c0 = (uint)((probeRad + probeRad + 0.5) / 0.05 + 2.0);
  lVar11 = (long)(int)local_1c0;
  local_1bc = spike;
  local_1b8 = (FILE *)outf;
  local_1c8 = malloc(lVar11 * 8);
  if (Lgapbins == '\x01') {
    uVar12 = 0;
    uVar16 = 0;
    if (0 < (int)local_1c0) {
      uVar16 = (ulong)local_1c0;
    }
    for (; uVar16 != uVar12; uVar12 = uVar12 + 1) {
      *(undefined8 *)((long)local_1c8 + uVar12 * 8) = 0;
    }
  }
  mast[0] = "vdw contact";
  mast[1] = "vdw contact";
  if (LMasterName == '\x01') {
    sprintf(extraMstr," master={%s}",extrastr);
  }
  else {
    extraMstr[0] = '\0';
  }
  __stream = local_1b8;
  fprintf(local_1b8,"@subgroup dominant {%s}\n",groupname);
  if (method == 0) {
    pcVar17 = "surface";
    mast[1] = "surface";
  }
  else {
    if (((OutputVDWs | OnlyBadOut) & 1) == 0) {
      fprintf(__stream,"@master {%s}\n","vdw contact");
    }
    if (((~OutputClashes | OnlyBadOut) & 1) != 0) {
      if ((OnlyBadOut & 1) == 0) {
        fprintf(__stream,"@master {%s}\n","small overlap");
      }
      fprintf(__stream,"@master {%s}\n","bad overlap");
      if (LworseOverlap == '\x01') {
        fprintf(__stream,"@master {%s}\n","worse overlap");
      }
    }
    if (((OutputHBs != '\0') || ((OnlyBadOut & 1) != 0)) ||
       (fprintf(__stream,"@master {%s}\n","H-bonds"), LweakHbonds != '\x01')) goto LAB_0012d3da;
    pcVar17 = "weak H-bonds";
  }
  fprintf(__stream,"@master {%s}\n",pcVar17);
LAB_0012d3da:
  if (0 < mcmccont[0][7]) {
    fprintf(__stream,"@pointmaster \'%c\' {McMc contacts}\n",0x4d);
  }
  if (0 < scsccont[0][7]) {
    fprintf(__stream,"@pointmaster \'%c\' {ScSc contacts}\n",0x53);
  }
  if (0 < mcsccont[0][7]) {
    fprintf(__stream,"@pointmaster \'%c\' {McSc contacts}\n",0x50);
  }
  if (0 < othrcont[0][7]) {
    fprintf(__stream,"@pointmaster \'%c\' {Hets contacts}\n",0x4f);
  }
  if (Lgapbins == '\x01') {
    for (lVar25 = 0; lVar25 != 0x16; lVar25 = lVar25 + 1) {
      fprintf(__stream,"@pointmaster \'%c\' {gap %3.2f}\n",
              (double)((int)lVar25 + -0xb) / 20.0 + 0.05,
              (ulong)(uint)(int)(char)(&DAT_0013d970)[lVar25]);
    }
  }
  uVar12 = 0;
  if (0 < (int)local_1c0) {
    uVar12 = (ulong)local_1c0;
  }
  lVar25 = 0;
  local_1b0 = (dotNode *(*) [7])0x135b9f;
  local_180 = 0;
  do {
    if (lVar25 == 0x72) {
      if (Lgapbins == '\x01') {
        fwrite("@text\n",6,1,__stream);
        for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
          fprintf(__stream,"{%5.2f, %8.0ld }\n",((double)(int)uVar16 + -11.0) / 20.0 + 0.05,
                  *(undefined8 *)((long)local_1c8 + uVar16 * 8));
        }
        fwrite("@kinemage 2\n",0xc,1,__stream);
        fwrite("@group {gapbins} dominant\n",0x1a,1,__stream);
        fwrite("@vectorlist {gapbins}\n",0x16,1,__stream);
        uVar24 = 1;
        if (1 < (int)local_1c0) {
          uVar24 = local_1c0;
        }
        for (uVar12 = 0; uVar24 - 1 != uVar12; uVar12 = uVar12 + 1) {
          dVar27 = ((double)(int)uVar12 + -11.0) / 20.0 + 0.05;
          fprintf(__stream,"{%5.2f, %8.0ld } %5.2f, %8f, 0.00\n",dVar27,
                  SUB84(dVar27 * (double)local_180,0),
                  (double)*(long *)((long)local_1c8 + uVar12 * 8));
        }
        fwrite("@labellist {gapbins}\n",0x15,1,__stream);
        fwrite("{0} 0.0, -1.0, 0.0\n",0x13,1,__stream);
        if (LXHvector == '\x01') {
          fwrite("@kinemage 3\n",0xc,1,__stream);
          fwrite("@pointmaster \'A\' {B<=10}\n",0x19,1,__stream);
          fwrite("@pointmaster \'B\' {B<=15}\n",0x19,1,__stream);
          fwrite("@pointmaster \'C\' {B<=20}\n",0x19,1,__stream);
          fwrite("@pointmaster \'D\' {B<=25}\n",0x19,1,__stream);
          fwrite("@pointmaster \'E\' {B<=30}\n",0x19,1,__stream);
          fwrite("@pointmaster \'F\' {B<=40}\n",0x19,1,__stream);
          fwrite("@pointmaster \'G\' {B<=50}\n",0x19,1,__stream);
          fwrite("@pointmaster \'H\' {B >50}\n",0x19,1,__stream);
          fwrite("@group {AXES} dominant\n",0x17,1,__stream);
          fwrite("@labellist {gapbins}\n",0x15,1,__stream);
          for (uVar18 = 0; uVar24 - 1 != uVar18; uVar18 = uVar18 + 1) {
            dVar27 = ((double)(int)uVar18 + -11.0) / 20.0 + 0.05;
            fprintf(__stream,"{%5.2f} %5.2f, 0.00, 0.00\n",dVar27,SUB84(dVar27 * 100.0,0));
          }
          dVar27 = 90.0;
          for (uVar24 = 0x5a; uVar24 < 0xb5; uVar24 = uVar24 + 10) {
            fprintf(__stream,"{%5.2f} -70.0, %5.2f, 0.00\n",dVar27,
                    SUB84((double)(int)(uVar24 - 0x5a),0));
            dVar27 = dVar27 + 10.0;
          }
          for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
            strcName[lVar11] = inputfilename[lVar11];
          }
          fprintf(__stream,"@group {%8s} dominant animate\n",strcName);
          fwrite("@dotlist {gapangle}\n",0x14,1,__stream);
          for (pvVar15 = (void *)0x0; pvVar15 != (void *)0x72; pvVar15 = (void *)((long)pvVar15 + 1)
              ) {
            local_1b0 = results + (long)pvVar15;
            local_1c8 = pvVar15;
            for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
              pdVar23 = (*local_1b0)[lVar11];
              if (pdVar23 != (dotNode *)0x0) {
                for (; pdVar23 != (dotNode *)0x0; pdVar23 = pdVar23->next) {
                  paVar4 = pdVar23->a;
                  paVar6 = pdVar23->t;
                  iVar19 = 0;
                  for (uVar24 = 0; uVar24 != 10; uVar24 = uVar24 + 1) {
                    if (paVar4->bval < (float)iVar19) {
                      if (uVar24 < 3) {
                        ptm[0] = 'A';
                        goto LAB_0012e052;
                      }
                      if (uVar24 == 3) {
                        ptm[0] = 'B';
                        goto LAB_0012e052;
                      }
                      if (uVar24 < 5) {
                        ptm[0] = 'C';
                        goto LAB_0012e052;
                      }
                      if (uVar24 == 5) {
                        ptm[0] = 'D';
                        goto LAB_0012e052;
                      }
                      if (uVar24 < 7) {
                        ptm[0] = 'E';
                        goto LAB_0012e052;
                      }
                      if (uVar24 != 9) {
                        if (uVar24 == 7) {
                          ptm[0] = 'F';
                        }
                        else {
                          ptm[0] = 'G';
                        }
                        goto LAB_0012e052;
                      }
                      break;
                    }
                    iVar19 = iVar19 + 5;
                  }
                  ptm[0] = 'H';
LAB_0012e052:
                  prVar5 = paVar4->r;
                  uVar28 = SUB84((double)paVar4->bval,0);
                  prVar7 = paVar6->r;
                  fprintf(local_1b8,
                          "{%6s %s%c%s%s%c%s:O=%4.2f, B=%6.2f; %s%c%s%s%c%s:O=%4.2f, B=%6.2f; GAP %6.3f}\'%s\' %8.3f, %8.3f , %8.3f\n"
                          ,(double)paVar4->occ,uVar28,(double)paVar6->occ,(double)paVar6->bval,
                          (double)pdVar23->gap,(double)(pdVar23->gap * 100.0),
                          (double)pdVar23->angle + -90.0,uVar28,strcName,paVar4->atomname,
                          (ulong)(uint)(int)paVar4->altConf,prVar5->resname,prVar5->Hy36resno,
                          (ulong)(uint)(int)prVar5->resInsCode,prVar5->chain,paVar6->atomname,
                          (ulong)(uint)(int)paVar6->altConf,prVar7->resname,prVar7->Hy36resno,
                          (ulong)(uint)(int)prVar7->resInsCode,prVar7->chain,ptm);
                }
                fputc(10,local_1b8);
                pvVar15 = local_1c8;
              }
            }
          }
        }
      }
      return;
    }
    for (uVar16 = 0; uVar16 != 7; uVar16 = uVar16 + 1) {
      pdVar22 = results[lVar25][uVar16];
      iVar19 = (int)uVar16;
      if (pdVar22 != (dotNode *)0x0) {
        iVar10 = (int)lVar25;
        if (uVar16 < 2) {
          if (AtomMasters != '\x01') {
            if ((LOneDotEach & 1) == 0) {
              local_1e0 = getColor(iVar10);
              pcVar13 = mast[uVar16];
              pcVar20 = "";
              if (LensDots != '\0') {
                pcVar20 = " lens";
              }
              pcVar21 = "@dotlist {x} color=%s master={%s}%s%s\n";
            }
            else {
              local_1e0 = getColor(iVar10);
              pcVar13 = mast[uVar16];
              pcVar20 = "";
              if (LensDots != '\0') {
                pcVar20 = " lens";
              }
              pcVar21 = "@balllist {x} radius=0.2 color=%s master={%s}%s%s\n";
            }
            pcVar17 = extraMstr;
            goto LAB_0012d8d2;
          }
          if ((LOneDotEach & 1) == 0) {
            local_1e0 = getColor(iVar10);
            pcVar13 = getAtomName(iVar10);
            pcVar17 = mast[uVar16];
            pcVar21 = "";
            if (LensDots != '\0') {
              pcVar21 = " lens";
            }
            pcVar20 = "@dotlist {x} color=%s master={%s dots} master={%s}%s%s\n";
          }
          else {
            local_1e0 = getColor(iVar10);
            pcVar13 = getAtomName(iVar10);
            pcVar17 = mast[uVar16];
            pcVar21 = "";
            if (LensDots != '\0') {
              pcVar21 = " lens";
            }
            pcVar20 = "@balllist {x} radius=0.2 color=%s master={%s dots} master={%s}%s%s\n";
          }
          fprintf(__stream,pcVar20,local_1e0,pcVar13,pcVar17,extraMstr,pcVar21);
        }
        else {
          if (iVar19 - 3U < 3 && local_1bc != 0) {
            if (AtomMasters != '\x01') {
              if ((LOneDotEach & 1) == 0) {
                pcVar13 = getColor(iVar10);
                pcVar17 = mast[uVar16];
                pcVar21 = "@vectorlist {x} color=%s master={%s}%s\n";
              }
              else {
                pcVar13 = getColor(iVar10);
                pcVar17 = mast[uVar16];
                pcVar21 = "@vectorlist {x} width=7 color=%s master={%s}%s\n";
              }
LAB_0012d8fc:
              fprintf(__stream,pcVar21,pcVar13,pcVar17,extraMstr);
              goto LAB_0012d90b;
            }
            if ((LOneDotEach & 1) == 0) {
              local_1e0 = getColor(iVar10);
              pcVar13 = getAtomName(iVar10);
              pcVar17 = mast[uVar16];
              pcVar21 = "@vectorlist {x} color=%s master={%s dots} master={%s}%s\n";
            }
            else {
              local_1e0 = getColor(iVar10);
              pcVar13 = getAtomName(iVar10);
              pcVar17 = mast[uVar16];
              pcVar21 = "@vectorlist {x} width=7 color=%s master={%s dots} master={%s}%s\n";
            }
          }
          else {
            if (uVar16 == 6) {
              if (AtomMasters != '\x01') {
                if ((LOneDotEach & 1) == 0) {
                  pcVar13 = getColor(iVar10);
                  pcVar17 = mast[6];
LAB_0012d8f2:
                  pcVar21 = "@dotlist {x} color=%s master={%s}%s\n";
                }
                else {
                  pcVar13 = getColor(iVar10);
                  pcVar17 = mast[6];
LAB_0012d875:
                  pcVar21 = "@ringlist {x} radius=0.2 color=%s master={%s}%s\n";
                }
                goto LAB_0012d8fc;
              }
              if ((LOneDotEach & 1) == 0) {
                local_1e0 = getColor(iVar10);
                pcVar13 = getAtomName(iVar10);
                pcVar17 = mast[6];
LAB_0012d8bb:
                pcVar21 = "@dotlist {x} color=%s master={%s dots} master={%s}%s\n";
                goto LAB_0012d8c5;
              }
              local_1e0 = getColor(iVar10);
              pcVar13 = getAtomName(iVar10);
              pcVar17 = mast[6];
            }
            else {
              if (LweakHbonds != '\x01') goto LAB_0012d90b;
              if (AtomMasters != '\x01') {
                if ((LOneDotEach & 1) == 0) {
                  pcVar13 = getColor(iVar10);
                  pcVar17 = mast[uVar16];
                  goto LAB_0012d8f2;
                }
                pcVar13 = getColor(iVar10);
                pcVar17 = mast[uVar16];
                goto LAB_0012d875;
              }
              if ((LOneDotEach & 1) == 0) {
                local_1e0 = getColor(iVar10);
                pcVar13 = getAtomName(iVar10);
                pcVar17 = mast[uVar16];
                goto LAB_0012d8bb;
              }
              local_1e0 = getColor(iVar10);
              pcVar13 = getAtomName(iVar10);
              pcVar17 = mast[uVar16];
            }
            pcVar21 = "@ringlist {x} radius=0.2 color=%s master={%s dots} master={%s}%s\n";
          }
LAB_0012d8c5:
          pcVar20 = extraMstr;
LAB_0012d8d2:
          fprintf(__stream,pcVar21,local_1e0,pcVar13,pcVar17,pcVar20);
        }
LAB_0012d90b:
        lastpointid[0] = '\0';
      }
      bVar26 = local_1bc != 0;
      for (; pFVar9 = local_1b8, pdVar22 != (dotNode *)0x0; pdVar22 = pdVar22->next) {
        if (Lgapbins == '\x01') {
          local_1d0 = 0x20;
          uStack_1cf = 0x27;
          local_1cd = 0x20;
          uStack_1cc = 0x27;
          uStack_1cb = 0x20;
          uStack_1ca = 0;
          local_1ce = pdVar22->ptmaster;
        }
        else if (pdVar22->ptmaster == ' ') {
          local_1d0 = 0;
        }
        else {
          local_1d0 = 0x20;
          uStack_1cf = 0x27;
          local_1cd = 0x27;
          uStack_1cc = 0x20;
          uStack_1cb = 0;
          local_1ce = pdVar22->ptmaster;
        }
        paVar4 = pdVar22->a;
        prVar5 = paVar4->r;
        if (LOneDotEach == 1) {
          paVar6 = pdVar22->t;
          prVar7 = paVar6->r;
          sprintf(pointid,"%s%c%s%s%c%s %s%c%s%s%c%s GAP %6.3f",(double)pdVar22->gap,
                  paVar4->atomname,(ulong)(uint)(int)paVar4->altConf,prVar5->resname,
                  prVar5->Hy36resno,(ulong)(uint)(int)prVar5->resInsCode,prVar5->chain,
                  paVar6->atomname,(ulong)(uint)(int)paVar6->altConf,prVar7->resname,
                  prVar7->Hy36resno,(ulong)(uint)(int)prVar7->resInsCode,prVar7->chain);
          __stream = pFVar9;
        }
        else {
          sprintf(pointid,"%s%c%s%s%c%s",paVar4->atomname,(ulong)(uint)(int)paVar4->altConf,
                  prVar5->resname,prVar5->Hy36resno,(ulong)(uint)(int)prVar5->resInsCode,
                  prVar5->chain);
        }
        iVar10 = strcmp(pointid,lastpointid);
        if (iVar10 == 0) {
          fwrite("{\"}",3,1,__stream);
        }
        else {
          strcpy(lastpointid,pointid);
          fprintf(__stream,"{%s}",pointid);
        }
        if (ColorGap == '\0') {
          if (pdVar22->t == (atom *)0x0) {
            fprintf(__stream,"%s ",OutPointColor);
          }
          else {
            local_1b0 = (dotNode *(*) [7])assignGapColorForKin(pdVar22->gap,iVar19);
            fputs((char *)local_1b0,__stream);
          }
        }
        if (Lgapbins == '\x01') {
          for (lVar14 = 0; uVar24 = (uint)lVar14, (uint)uVar12 != uVar24; lVar14 = lVar14 + 1) {
            if (pdVar22->gap < ((float)(int)uVar24 + -11.0) / 20.0 + 0.05) {
              local_1cd = (&DAT_0013d970)[lVar14];
              lVar8 = *(long *)((long)local_1c8 + lVar14 * 8);
              lVar1 = lVar8 + 1;
              *(long *)((long)local_1c8 + lVar14 * 8) = lVar1;
              if (local_180 <= lVar8) {
                local_180 = lVar1;
              }
              if (uVar24 < 0x16) goto LAB_0012db9b;
              break;
            }
          }
          local_1cd = 0x5a;
          plVar2 = (long *)((long)local_1c8 + lVar11 * 8 + -8);
          *plVar2 = *plVar2 + 1;
        }
LAB_0012db9b:
        dVar27 = (pdVar22->loc).x;
        uVar28 = SUB84((pdVar22->loc).y,0);
        dVar3 = (pdVar22->loc).z;
        if (iVar19 - 3U < 3 && bVar26) {
          fprintf(__stream,"P %s%.3f,%.3f,%.3f {\"}%s %s%.3f,%.3f,%.3f\n",dVar27,uVar28,dVar3,
                  (pdVar22->spike).x,(pdVar22->spike).y,(pdVar22->spike).z,&local_1d0,local_1b0,
                  &local_1d0);
        }
        else {
          fprintf(__stream,"%s%.3f,%.3f,%.3f\n",dVar27,uVar28,dVar3,&local_1d0);
        }
      }
    }
    lVar25 = lVar25 + 1;
  } while( true );
}

Assistant:

void writeOutput(FILE *outf, char* groupname, dotNode *results[][NODEWIDTH], int spike, int method, char* extrastr, float probeRad)
{ /*writeOutput for kinemage*/
   /*add probeRad 20111220dcr*/
   /*dcr041020 need method for better kinemage keywords*/
   /* 060129 extrastr for extra master to control orig vs fitted dots */
   int i, j;
   int k; /*counter for gapbins 111020dcr*/
   char ptm[2] = {' ','\0'}; /*20120120dcr ptmaster for bval*/
   dotNode *node;
   atom *a; /*owner of dot*/
   atom *t; /*cause of dot, output for OneDotEach mode 110113*/
   char *color = "";
  // OLD: char *mast[NODEWIDTH] = {"wide  contact", "close contact", "small overlap",
                           // "bad overlap", "H-bonds", "H-weaks"};
                            /*111215dcr weakHbonds option*/
   char *mast[NODEWIDTH] = {"wide contact", "close contact", "weak H-bonds", "small overlap", "bad overlap",
                            "worse overlap", "H-bonds"}; /* 04/13/2015 SJ changed to match new NODEWIDTH, see probe.h*/
   char *surfacestr = "surface"; /*041020*/
   char *contactstr = "vdw contact"; /*060129*/
   char extraMstr[32]; /*fill below with extra master name 060129*/
   char pointid[100], lastpointid[100];
   char ptmast[7]={'\0','\0','\0','\0','\0','\0','\0'}; /*111020dcr 6 to 7 */
   /*dcr041009 string to hold 'M' (McMc), 'S' (ScSc), 'P' (McSc), 'O' (other)*/
   /*dcr041009 ptmaster part of each dotNode member of results[][]*/
   char masterchr=' '; /*dcr041017*/
/*111020dcr gapbin ptmasters*/
   int ngapbins = 22; /*(std probe diameter .5 +clash overlap .5=1.0/0.05interval) +2*/
   /*+1 for 0th fence post, another +1 for X excess*/
   char gapnamestr[22] =
{'z','y','x','w','v','u','t','g','r','q','f','F','Q','R','G','T','U','V','W','X','Y','Z'};
/*0 , 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 , 9 ,10 ,11 ,12 ,13 ,14 ,15 ,16 ,17 ,18 ,19 ,20 ,21*/
   /*std gapbins scope at least -.5 to +.5, wider if probeRad > 0.25 standard*/
   int  gaplimit = ((2*(probeRad>0.25f?probeRad:0.25f) +0.5f)/0.05f)+2;  /*20111220dcr*/
   long *gapcounts = (long *) malloc(gaplimit * sizeof(long));
   long maxgapcounts = 0;
   int  Lgotgapbin = FALSE;
   char strcName[6]; /*first nendstr char of inputfilename 20120120dcr*/
   int  nendstr = 6;

   if(Lgapbins) /*111020dcr gapbins pointmasters, 111215dcr count bin entries*/
   {
      for(k=0; k<gaplimit;k++)
      {
         gapcounts[k] = 0;
      }
   }

   if(LMergeContacts)  /*060129*/
   {
      mast[0] = contactstr;
      mast[1] = contactstr;
   }
   if(LMasterName)  /*060129*/
   {
      sprintf(extraMstr," master={%s}",extrastr);
   }
   else{extraMstr[0] = '\0';} /*occupies no space in output*/

   fprintf(outf, "@subgroup dominant {%s}\n", groupname);
   /*list masters for contact types dcr041020*/
   if(method == EXTERNALSURFACE) /*dcr041020*/
   {/*a bit crude, but better than calling all surfaces a close contact*/
      mast[1] = surfacestr; /*the only master button invoked dcr041020*/
      fprintf(outf, "@master {%s}\n", mast[1]); /*was close contact*/
   }
   else
   {/*fine control over masters names   dcr041020*/
      if (OutputVDWs && !OnlyBadOut) { /*dcr041010*/
         fprintf(outf, "@master {%s}\n", mast[0]);
        if(!LMergeContacts)
         fprintf(outf, "@master {%s}\n", mast[1]);
      }
      if (OutputClashes || OnlyBadOut) { /*dcr041010*/
         if(!OnlyBadOut) {
             //fprintf(outf, "@master {%s}\n", mast[2]);
             fprintf(outf, "@master {%s}\n", mast[3]); /* 04/13/2015 SJ changed to match new number for small overlaps*/
         }
         //fprintf(outf, "@master {%s}\n", mast[3]); /*the Bad clashes*/
         fprintf(outf, "@master {%s}\n", mast[4]); /* 04/13/2015 SJ changed to match new number for bad overlaps*/
          if (LworseOverlap) {/* 04/13/2015 SJ if the worse overlaps are separated*/
              fprintf(outf, "@master {%s}\n", mast[5]);
          }
      }
      if (OutputHBs && !OnlyBadOut)
      { /*dcr041010*/
         //fprintf(outf, "@master {%s}\n", mast[4]);/* 04/13/2015 SJ changed to match new number for H bonds*/
         fprintf(outf, "@master {%s}\n", mast[6]);
         if(LweakHbonds) /*111215dcr*/
         {
            //fprintf(outf, "@master {%s}\n", mast[5]);
             fprintf(outf, "@master {%s}\n", mast[2]);/* 04/13/2015 SJ changed to match new number for weak H bonds*/
         }
      }
   }/*fine control over masters names*/ /* 04/15/2015 SJ changing all 5s to 7s to reflect new initialization*/
   //if(mcmccont[0][5] > 0)
   if(mcmccont[0][7] > 0)
   {
      masterchr = MCMCCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {McMc contacts}\n",masterchr);
   }
   //if(scsccont[0][5] > 0)
   if(scsccont[0][7] > 0)
   {
      masterchr = SCSCCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {ScSc contacts}\n",masterchr);
   }
   //if(mcsccont[0][5] > 0)
   if(mcsccont[0][7] > 0)
   {
      masterchr = MCSCCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {McSc contacts}\n",masterchr);
   }
   //if(othrcont[0][5] > 0)
   if(othrcont[0][7] > 0)
   {
      masterchr = OTHERCHR; /*single char*/
      fprintf(outf, "@pointmaster '%c' {Hets contacts}\n",masterchr);
   }
   if(Lgapbins) /*111020dcr*/
   {
      for(i = 0; i < ngapbins; i++)
      {
        fprintf(outf, "@pointmaster '%c' {gap %3.2f}\n"
                ,gapnamestr[i],(((float)i-11.0)/20.0)+0.05); /*20111220dcr +0.05*/
      }
   }
   for (i = 0; i < NUMATOMTYPES; i++)
   {/*i: Hatom varients + rest of periodic table + base types, see atomprops.h*/
      for (j = 0; j < NODEWIDTH; j++)
      {/* OLD j: wide contact, close contact, small overlap, bad overlap, H-bonds*/
              /*OLD optionally: H-weaks if LweakHbonds  111215dcr*/
          /* NEW 04/13/2015 - SJ j: wide contact, close contact, weak H bonds, small overlap, bad overlap, worse overlap, H-bonds*/
         node = results[i][j]; /*head of list of dot nodes, i.e. first node*/
         if (node)
         {/*node exists, write list headers*/
           if (j == 0 || j == 1) /*wide and close contacts*/
           {/* contact */
             if (AtomMasters)
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@balllist {x} radius=0.2 color=%s master={%s dots} master={%s}%s%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr,
                  LensDots ? " lens" : "");
                }
                else
                {
                   fprintf(outf,
                   "@dotlist {x} color=%s master={%s dots} master={%s}%s%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr,
                   LensDots ? " lens" : "");
                }
             }
             else
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                     "@balllist {x} radius=0.2 color=%s master={%s}%s%s\n",
                   getColor(i), mast[j],extraMstr,
                   LensDots ? " lens" : "");
                }
                else
                {
                    fprintf(outf,
                      "@dotlist {x} color=%s master={%s}%s%s\n",
                    getColor(i), mast[j],extraMstr,
                    LensDots ? " lens" : "");
                }
             }
           }/* contact */
          // else if ((j == 2 || j == 3) && spike)
           else if ((j == 3 || j == 4 || j == 5) && spike) /* 04/13/2015 SJ changed to reflect new numbers for different categories*/
           {/* bump w/ spike */
			  if (AtomMasters) 
              {
                 if(LOneDotEach)
                 {
					  fprintf(outf,
					  "@vectorlist {x} width=7 color=%s master={%s dots} master={%s}%s\n", 
					 getColor(i), getAtomName(i), mast[j],extraMstr); 
			     }
                 else
                 {
					 fprintf(outf,
					 "@vectorlist {x} color=%s master={%s dots} master={%s}%s\n",
					 getColor(i), getAtomName(i), mast[j],extraMstr); 
			     }
              }
              else
              {
                 if(LOneDotEach)
                 {
					fprintf(outf,
					 "@vectorlist {x} width=7 color=%s master={%s}%s\n",
					 getColor(i), mast[j],extraMstr); 
	             }
                 else
                 {
					 fprintf(outf,
					 "@vectorlist {x} color=%s master={%s}%s\n",
					 getColor(i), mast[j],extraMstr); 
			     }
              }
           }/* bump w/ spike */
           //else if (j == 4)
           else if (j == 6)/* 04/13/2015 SJ changed to reflect new numbers for different categories*/
           {/* bump w/o spike or H-bond */
             if (AtomMasters)
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                    "@dotlist {x} color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
             }
             else
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                  "@dotlist {x} color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
             }
           }/* bump w/o spike or H-bond */
           else if (LweakHbonds)
           {/* H-weak */
             if (AtomMasters)
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                    "@dotlist {x} color=%s master={%s dots} master={%s}%s\n",
                   getColor(i), getAtomName(i), mast[j],extraMstr);
                }
             }
             else
             {
                if(LOneDotEach)
                {
                   fprintf(outf,
                   "@ringlist {x} radius=0.2 color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
                else
                {
                   fprintf(outf,
                  "@dotlist {x} color=%s master={%s}%s\n",
                   getColor(i), mast[j],extraMstr);
                }
             }
           }/* H-weak */

           lastpointid[0] = '\0'; /* reset */
         }/*node exists, write list headers*/
	 while(node)
         {/*kinemage point or point-line for each node in (ij)th dot-node list*/
            a = node->a; /*owner of dot*/
            t = node->t; /*cause of dot, use for OneDotEach 111013dcr*/
            if(Lgapbins) /*111020dcr*/
            {/*two characters for two pointmasters*/
               ptmast[0] = ' '; /*insure leading space*/
               ptmast[1] = '\''; /*surround char pointmasters with*/
               ptmast[2] = node->ptmaster;
               ptmast[3] = ' '; /*space for later gapbin character 111020dcr*/
               ptmast[4] = '\''; /*single quote marks*/
               ptmast[5] = ' '; /*need trailing space*/
               ptmast[6] = '\0'; /*end string*/
            }
            else if(node->ptmaster == ' ') /*dcr041009*/
            {/*blank means NO pointmaster*/
               ptmast[0] = '\0'; /*which will print as a zero-length str*/
            }
            else
            {
               ptmast[0] = ' '; /*insure leading space*/
               ptmast[1] = '\''; /*surround single char pointmaster with*/
               ptmast[2] = node->ptmaster;
               ptmast[3] = '\''; /*single quote marks*/
               ptmast[4] = ' '; /*need trailing space*/
               ptmast[5] = '\0'; /*end string*/
            }
/*     sprintf(pointid, "%s%c %s%d%c", */
/*       a->atomname, a->altConf, */
/*       a->r->resname, a->r->resid, */
/*       a->r->resInsCode); */
            if(LOneDotEach) /*report cause of dot after owner of dot 111013dcr*/
            {
               sprintf(pointid, "%s%c%s%s%c%s %s%c%s%s%c%s GAP %6.3f",
                  a->atomname, a->altConf,
                  a->r->resname, a->r->Hy36resno,
                  a->r->resInsCode, a->r->chain,
                  t->atomname, t->altConf,
                  t->r->resname, t->r->Hy36resno,
                  t->r->resInsCode, t->r->chain, node->gap);
            }
            else
            {/*usual just report owner of dot*/
               sprintf(pointid, "%s%c%s%s%c%s",
               a->atomname, a->altConf,
               a->r->resname, a->r->Hy36resno,
               a->r->resInsCode, a->r->chain);
            }

            if (strcmp(pointid, lastpointid))
            {
               strcpy(lastpointid, pointid);
               fprintf(outf, "{%s}", pointid);
            }
            else
            {
               fprintf(outf, "{\"}");
            }
            if (ColorGap)
            {
               if (node->t)
               {
                  color = assignGapColorForKin(node->gap, j);
                  fprintf(outf, "%s", color);
               }
               else
               {
                  fprintf(outf, "%s ", OutPointColor);
               }
               /* added "%s" string format to color and */
               /* edited "%s " to "%s" in OutPointColor, wba 110909 */
               /* edited "%s" back to "%s " in OutPointColor, gjk 1200907 */
            }
            if(Lgapbins) /*111020dcr gapbins pointmasters*/
            {
               Lgotgapbin = FALSE; /*until identify which gapbin*/
               for(k=0; k<gaplimit ;k++) /*20111220dcr ngapbins, just std range*/
               {
                  if(node->gap < (((float)k-11.0)/20.0)+0.05 )
                  {/*pt master intervals of 0.05 from -0.5 to +0.5*/
                     ptmast[3] = gapnamestr[k];
                     gapcounts[k] = gapcounts[k] +1;
                     if(gapcounts[k] > maxgapcounts){maxgapcounts = gapcounts[k];}
                     if(k < ngapbins)
                     {
                        Lgotgapbin = TRUE; /*got the gapbin idenity for this dot*/
                     }
                     break; /*out of for loop*/
                  }
               }
               if(!Lgotgapbin)
               {/*assign this node, aka dot, to overflow gapbin*/
                  ptmast[3] = gapnamestr[ngapbins-1]; /*the overflow bin-master*/
                  gapcounts[gaplimit-1] = gapcounts[gaplimit-1] +1; /*last gapbin*/
                  /*if(gapcounts[gaplimit-1] > maxgapcounts)
                          {maxgapcounts = gapcounts[gaplimit-1];}*/
               }
            }
            //if ((j == 2 || j == 3) && spike)
            if ((j == 3 || j == 4 || j == 5) && spike)/* 04/13/2015 SJ changed to reflect new numbers for different categories*/
            {/* bump */
              fprintf(outf,
                     "P %s%.3f,%.3f,%.3f {\"}%s %s%.3f,%.3f,%.3f\n", /*dcr041009*/
                      ptmast,node->loc.x, node->loc.y, node->loc.z, /*dcr041009*/
                      color,      /*** note: second color reference */
                      ptmast,node->spike.x, node->spike.y, node->spike.z); /*dcr041009*/
            }
            else
            {/* contact or H-bond */
              fprintf(outf, "%s%.3f,%.3f,%.3f\n", /*dcr041009*/
                      ptmast,node->loc.x, node->loc.y, node->loc.z); /*dcr041009*/
            }
            node = node->next; /*in this (ij)th dot-node list*/
         }/*kinemage point or point-line for each node in (ij)th dot-node list*/
      }/*OLD j: wide contact, close contact, small overlap, bad overlap, H-bonds*/ /* see new def in NODEWIDTH probe.h*/
   }/*i: Hatom varients + rest of periodic table + base types, see atomprops.h*/
   if(Lgapbins) /*111020dcr gapbins pointmasters, 111215dcr count bin entries*/
   {/*Lgapbins TRUE*/
      fprintf(outf, "@text\n");
      for(k=0; k<gaplimit;k++) /*20111220dcr gaplimit*/
      {
          fprintf(outf, "{%5.2f, %8.0ld }\n",
             ((((float)k-11.0)/20.0)+0.05),gapcounts[k]);
      }

/*kinemage 2*/
      fprintf(outf, "@kinemage 2\n");
      fprintf(outf, "@group {gapbins} dominant\n");
      fprintf(outf, "@vectorlist {gapbins}\n");
      for(k=0; k<(gaplimit-1);k++) /*not plot sum of all over-wide dots*/
      {
          fprintf(outf, "{%5.2f, %8.0ld } %5.2f, %8f, 0.00\n",
             ((((float)k-11.0)/20.0)+0.05),gapcounts[k],
             ((((float)k-11.0)/20.0)+0.05)*(float)maxgapcounts,(float)gapcounts[k]);
      }
      fprintf(outf, "@labellist {gapbins}\n");
      fprintf(outf, "{0} 0.0, -1.0, 0.0\n");

/*kinemage 3*/
     if(LXHvector)
     {
      /*write list headers*/
      fprintf(outf, "@kinemage 3\n");
      /*for(k=1; k<10; k++){fprintf(outf, "@pointmaster '%d' {B<=%d}\n",k,10*k);}*/
      fprintf(outf, "@pointmaster 'A' {B<=10}\n");
      fprintf(outf, "@pointmaster 'B' {B<=15}\n");
      fprintf(outf, "@pointmaster 'C' {B<=20}\n");
      fprintf(outf, "@pointmaster 'D' {B<=25}\n");
      fprintf(outf, "@pointmaster 'E' {B<=30}\n");
      fprintf(outf, "@pointmaster 'F' {B<=40}\n");
      fprintf(outf, "@pointmaster 'G' {B<=50}\n");
      fprintf(outf, "@pointmaster 'H' {B >50}\n");

      fprintf(outf, "@group {AXES} dominant\n");
      fprintf(outf, "@labellist {gapbins}\n");
      for(k=0; k<(gaplimit-1);k++)
      {
          fprintf(outf, "{%5.2f} %5.2f, 0.00, 0.00\n",
             ((((float)k-11.0)/20.0)+0.05), 100*(((((float)k-11.0)/20.0)+0.05)) );
      }
      for(k=90; k<=180; k=k+10)
      {
         fprintf(outf, "{%5.2f} -70.0, %5.2f, 0.00\n",(float)k,(float)(k-90));
      }
      if(sizeof(inputfilename) < nendstr) {nendstr = sizeof(inputfilename);}
      for(k=0; k<nendstr; k++) {strcName[k]=inputfilename[k];}

      /*Note first nemdstr char of inputfilename 20120120dcr*/
      fprintf(outf, "@group {%8s} dominant animate\n",strcName);
      fprintf(outf, "@dotlist {gapangle}\n");

      for (i = 0; i < NUMATOMTYPES; i++)
      {/*i: Hatom varients + rest of periodic table + base types, see atomprops.h*/
       for (j = 0; j < NODEWIDTH; j++)
       {/*Old: j: wide contact, close contact, small overlap, bad overlap, H-bonds*/ /* see NODEWIDTH in probe.h for new def. SJ 04/16/2015*/
              /*optionally: H-weaks if LweakHbonds  111215dcr*/
        node = results[i][j]; /*head of list of dot nodes, i.e. first node*/
        if (node)
        {/*node exists*/

         while(node)
         {/*kinemage point or point-line for each node in (ij)th dot-node list*/
           a = node->a; /*owner of dot*/
           t = node->t; /*cause of dot, use for OneDotEach 111013dcr*/
           /* Slow way to determine integer truncation of k/5 with a maximum of 9. */
           for(k=0; k<10; k++){if(a->bval < k*5) {break;}}
           /*2:10A,3:15B,4:20C,5:25D,6:30E,8:40F,10:50G*/
           if(k<=2){ptm[0] = 'A';}
           else if(k<=3){ptm[0] = 'B';}
           else if(k<=4){ptm[0] = 'C';}
           else if(k<=5){ptm[0] = 'D';}
           else if(k<=6){ptm[0] = 'E';}
           else if(k<=7){ptm[0] = 'F';}
           else if(k<=8){ptm[0] = 'G';}
           else{ptm[0] = 'H';}
           /*Note first nemdstr char of inputfilename 20120120dcr*/
           fprintf(outf,"{%6s %s%c%s%s%c%s:O=%4.2f, B=%6.2f; %s%c%s%s%c%s:O=%4.2f, B=%6.2f; GAP %6.3f}'%s' %8.3f, %8.3f , %8.3f\n",
                  strcName,
                  a->atomname, a->altConf,
                  a->r->resname, a->r->Hy36resno,
                  a->r->resInsCode, a->r->chain, a->occ, a->bval,
                  t->atomname, t->altConf,
                  t->r->resname, t->r->Hy36resno,
                  t->r->resInsCode, t->r->chain, t->occ, t->bval, node->gap, ptm,
                  100*(node->gap), (node->angle)-90.0, a->bval);

           node = node->next; /*in this (ij)th dot-node list*/
         }/*kinemage point or point-line for each node in (ij)th dot-node list*/
         fprintf(outf, "\n");
        }/*node exists*/
       }/*NODEWIDTH*/
      }/*NUMATOMTYPES*/
     }/*LXHvector*/
  }/*Lgapbins TRUE*/

}